

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffppnujj(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,ULONGLONG *array,
            ULONGLONG nulval,int *status)

{
  int iVar1;
  LONGLONG local_50;
  long row;
  ULONGLONG nulval_local;
  ULONGLONG *array_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  long group_local;
  fitsfile *fptr_local;
  
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    local_50 = group;
    if (group < 1) {
      local_50 = 1;
    }
    ffpcnujj(fptr,2,local_50,firstelem,nelem,array,nulval,status);
    fptr_local._4_4_ = *status;
  }
  else {
    ffpmsg("writing TULONGLONG to compressed image is not supported");
    *status = 0x19d;
    fptr_local._4_4_ = 0x19d;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffppnujj( fitsfile *fptr,  /* I - FITS file pointer                       */
            long  group,     /* I - group to write(1 = 1st group)           */
            LONGLONG  firstelem, /* I - first vector element to write(1 = 1st)  */
            LONGLONG  nelem,     /* I - number of values to write               */
            ULONGLONG *array,    /* I - array of values that are written        */
            ULONGLONG  nulval,    /* I - undefined pixel value                   */
            int  *status)    /* IO - error status                           */
/*
  Write an array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being written).  Any array values
  that are equal to the value of nulval will be replaced with the null
  pixel value that is appropriate for this column.
*/
{
    long row;

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        ffpmsg("writing TULONGLONG to compressed image is not supported");

        return(*status = DATA_COMPRESSION_ERR);
    }

    row=maxvalue(1,group);

    ffpcnujj(fptr, 2, row, firstelem, nelem, array, nulval, status);
    return(*status);
}